

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sum_squares.c
# Opt level: O1

uint64_t aom_var_2d_u8_c(uint8_t *src,int src_stride,int width,int height)

{
  byte bVar1;
  long lVar2;
  long lVar3;
  int iVar4;
  ulong uVar5;
  
  iVar4 = 0;
  if (height < 1) {
    lVar3 = 0;
    lVar2 = 0;
  }
  else {
    lVar2 = 0;
    lVar3 = 0;
    do {
      if (0 < width) {
        uVar5 = 0;
        do {
          bVar1 = src[uVar5];
          lVar2 = lVar2 + (ulong)bVar1;
          lVar3 = lVar3 + (ulong)((uint)bVar1 * (uint)bVar1);
          uVar5 = uVar5 + 1;
        } while ((uint)width != uVar5);
      }
      src = src + src_stride;
      iVar4 = iVar4 + 1;
    } while (iVar4 != height);
  }
  return lVar3 - (ulong)(lVar2 * lVar2) / (ulong)(long)(height * width);
}

Assistant:

uint64_t aom_var_2d_u8_c(uint8_t *src, int src_stride, int width, int height) {
  int r, c;
  uint64_t ss = 0, s = 0;

  for (r = 0; r < height; r++) {
    for (c = 0; c < width; c++) {
      const uint8_t v = src[c];
      ss += v * v;
      s += v;
    }
    src += src_stride;
  }

  return (ss - s * s / (width * height));
}